

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_13uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  OPJ_INT32 *pOVar12;
  OPJ_INT32 OVar13;
  ulong uVar14;
  byte bVar15;
  byte *pbVar16;
  uint local_9c;
  int local_98;
  uint dst_6;
  int needed_6;
  uint dst_5;
  int needed_5;
  uint dst_4;
  int needed_4;
  uint dst_3;
  int needed_3;
  uint dst_2;
  int needed_2;
  uint dst_1;
  int needed_1;
  uint dst;
  int needed;
  int available;
  uint val;
  OPJ_UINT32 val12;
  OPJ_UINT32 val11;
  OPJ_UINT32 val10;
  OPJ_UINT32 val9;
  OPJ_UINT32 val8;
  OPJ_UINT32 val7;
  OPJ_UINT32 val6;
  OPJ_UINT32 val5;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffff8); _val1 = _val1 + 8) {
    OVar13 = *pDst_local;
    bVar15 = *(byte *)((long)pDst_local + 1);
    bVar1 = *(byte *)((long)pDst_local + 2);
    bVar2 = *(byte *)((long)pDst_local + 3);
    bVar3 = *(byte *)(pDst_local + 1);
    bVar4 = *(byte *)((long)pDst_local + 5);
    bVar5 = *(byte *)((long)pDst_local + 6);
    bVar6 = *(byte *)((long)pDst_local + 7);
    bVar7 = *(byte *)(pDst_local + 2);
    bVar8 = *(byte *)((long)pDst_local + 9);
    bVar9 = *(byte *)((long)pDst_local + 10);
    pbVar16 = (byte *)(pDst_local + 3);
    bVar10 = *(byte *)((long)pDst_local + 0xb);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 0xd);
    bVar11 = *pbVar16;
    pDst[_val1] = (uint)(byte)OVar13 << 5 | (uint)(bVar15 >> 3);
    pDst[_val1 + 1] = (bVar15 & 7) << 10 | (uint)bVar1 << 2 | (uint)(bVar2 >> 6);
    pDst[_val1 + 2] = (bVar2 & 0x3f) << 7 | (uint)(bVar3 >> 1);
    pDst[_val1 + 3] = (bVar3 & 1) << 0xc | (uint)bVar4 << 4 | (uint)(bVar5 >> 4);
    pDst[_val1 + 4] = (bVar5 & 0xf) << 9 | (uint)bVar6 << 1 | (uint)(bVar7 >> 7);
    pDst[_val1 + 5] = (bVar7 & 0x7f) << 6 | (uint)(bVar8 >> 2);
    pDst[_val1 + 6] = (bVar8 & 3) << 0xb | (uint)bVar9 << 3 | (uint)(bVar10 >> 5);
    pDst[_val1 + 7] = (bVar10 & 0x1f) << 8 | (uint)bVar11;
  }
  if ((length & 7) != 0) {
    uVar14 = length & 7;
    needed_1 = 0xd;
    dst_1 = 0;
    bVar15 = (byte)*pDst_local;
    pOVar12 = pDst_local;
    while( true ) {
      pDst_local = (OPJ_INT32 *)((long)pOVar12 + 1);
      needed = (int)bVar15;
      if (needed_1 < 9) break;
      needed_1 = needed_1 + -8;
      dst_1 = (needed | dst_1) << ((byte)needed_1 & 0x1f);
      bVar15 = *(byte *)pDst_local;
      pOVar12 = pDst_local;
    }
    dst = 8 - needed_1;
    pDst[_val1] = (uint)(bVar15 >> (8 - (byte)needed_1 & 0x1f)) &
                  (1 << ((byte)needed_1 & 0x1f)) - 1U | dst_1;
    if (1 < uVar14) {
      needed_2 = 0xd;
      dst_2 = 0;
      if (dst == 0) {
        needed = (int)*(byte *)pDst_local;
        dst = 8;
        pDst_local = (OPJ_INT32 *)((long)pOVar12 + 2);
      }
      while (bVar15 = (byte)dst, (int)dst < needed_2) {
        needed_2 = needed_2 - dst;
        dst_2 = (needed & (1 << (bVar15 & 0x1f)) - 1U | dst_2) << ((byte)needed_2 & 0x1f);
        needed = (int)(byte)*pDst_local;
        pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        dst = 8;
      }
      dst = dst - needed_2;
      pDst[_val1 + 1] =
           (uint)needed >> (bVar15 - (byte)needed_2 & 0x1f) & (1 << ((byte)needed_2 & 0x1f)) - 1U |
           dst_2;
      if (2 < uVar14) {
        needed_3 = 0xd;
        dst_3 = 0;
        if (dst == 0) {
          needed = (int)(byte)*pDst_local;
          dst = 8;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        }
        while (bVar15 = (byte)dst, (int)dst < needed_3) {
          needed_3 = needed_3 - dst;
          dst_3 = (needed & (1 << (bVar15 & 0x1f)) - 1U | dst_3) << ((byte)needed_3 & 0x1f);
          needed = (int)(byte)*pDst_local;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          dst = 8;
        }
        dst = dst - needed_3;
        pDst[_val1 + 2] =
             (uint)needed >> (bVar15 - (byte)needed_3 & 0x1f) & (1 << ((byte)needed_3 & 0x1f)) - 1U
             | dst_3;
        if (3 < uVar14) {
          needed_4 = 0xd;
          dst_4 = 0;
          if (dst == 0) {
            needed = (int)(byte)*pDst_local;
            dst = 8;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          }
          while (bVar15 = (byte)dst, (int)dst < needed_4) {
            needed_4 = needed_4 - dst;
            dst_4 = (needed & (1 << (bVar15 & 0x1f)) - 1U | dst_4) << ((byte)needed_4 & 0x1f);
            needed = (int)(byte)*pDst_local;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            dst = 8;
          }
          dst = dst - needed_4;
          pDst[_val1 + 3] =
               (uint)needed >> (bVar15 - (byte)needed_4 & 0x1f) &
               (1 << ((byte)needed_4 & 0x1f)) - 1U | dst_4;
          if (4 < uVar14) {
            needed_5 = 0xd;
            dst_5 = 0;
            if (dst == 0) {
              needed = (int)(byte)*pDst_local;
              dst = 8;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            }
            while (bVar15 = (byte)dst, (int)dst < needed_5) {
              needed_5 = needed_5 - dst;
              dst_5 = (needed & (1 << (bVar15 & 0x1f)) - 1U | dst_5) << ((byte)needed_5 & 0x1f);
              needed = (int)(byte)*pDst_local;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              dst = 8;
            }
            dst = dst - needed_5;
            pDst[_val1 + 4] =
                 (uint)needed >> (bVar15 - (byte)needed_5 & 0x1f) &
                 (1 << ((byte)needed_5 & 0x1f)) - 1U | dst_5;
            if (5 < uVar14) {
              needed_6 = 0xd;
              dst_6 = 0;
              if (dst == 0) {
                needed = (int)(byte)*pDst_local;
                dst = 8;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              }
              while (bVar15 = (byte)dst, (int)dst < needed_6) {
                needed_6 = needed_6 - dst;
                dst_6 = (needed & (1 << (bVar15 & 0x1f)) - 1U | dst_6) << ((byte)needed_6 & 0x1f);
                needed = (int)(byte)*pDst_local;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                dst = 8;
              }
              dst = dst - needed_6;
              pDst[_val1 + 5] =
                   (uint)needed >> (bVar15 - (byte)needed_6 & 0x1f) &
                   (1 << ((byte)needed_6 & 0x1f)) - 1U | dst_6;
              if (6 < uVar14) {
                local_98 = 0xd;
                local_9c = 0;
                if (dst == 0) {
                  needed = (int)(byte)*pDst_local;
                  dst = 8;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                }
                while ((int)dst < local_98) {
                  local_98 = local_98 - dst;
                  local_9c = (needed & (1 << ((byte)dst & 0x1f)) - 1U | local_9c) <<
                             ((byte)local_98 & 0x1f);
                  needed = (int)(byte)*pDst_local;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                  dst = 8;
                }
                pDst[_val1 + 6] =
                     (uint)needed >> ((byte)dst - (byte)local_98 & 0x1f) &
                     (1 << ((byte)local_98 & 0x1f)) - 1U | local_9c;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_13uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;
        OPJ_UINT32 val11 = *pSrc++;
        OPJ_UINT32 val12 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 5) | (val1 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7U) << 10) | (val2 << 2) | (val3 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0x3FU) << 7) | (val4 >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x1U) << 12) | (val5 << 4) | (val6 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val6 & 0xFU) << 9) | (val7 << 1) | (val8 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val8 & 0x7FU) << 6) | (val9 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val9 & 0x3U) << 11) | (val10 << 3) | (val11 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val11 & 0x1FU) << 8) | (val12));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 13)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 13)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 13)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 13)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 13)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 13)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 13)
                            }
                        }
                    }
                }
            }
        }
    }
}